

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushClipRect(ImVec2 *clip_rect_min,ImVec2 *clip_rect_max,
                        bool intersect_with_current_clip_rect)

{
  bool intersect_with_current_clip_rect_00;
  ImGuiWindow *pIVar1;
  byte in_DL;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  ImDrawList *unaff_retaddr;
  ImGuiWindow *window;
  ImVec4 *in_stack_ffffffffffffffc8;
  ImVec2 in_stack_ffffffffffffffd0;
  ImVec2 local_28;
  
  intersect_with_current_clip_rect_00 = (bool)(in_DL & 1);
  pIVar1 = GetCurrentWindow();
  ImDrawList::PushClipRect(unaff_retaddr,in_RDI,in_RSI,intersect_with_current_clip_rect_00);
  ImVector<ImVec4>::back(&pIVar1->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  (pIVar1->ClipRect).Min = in_stack_ffffffffffffffd0;
  (pIVar1->ClipRect).Max = local_28;
  return;
}

Assistant:

void ImGui::PushClipRect(const ImVec2& clip_rect_min, const ImVec2& clip_rect_max, bool intersect_with_current_clip_rect)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DrawList->PushClipRect(clip_rect_min, clip_rect_max, intersect_with_current_clip_rect);
    window->ClipRect = window->DrawList->_ClipRectStack.back();
}